

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump-to-file-example.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint64_t memLeakSize;
  size_t memLeakCount;
  uint local_28 [2];
  uint local_20 [2];
  
  __start(true,"mem_allocations.log",false);
  __mem_leak_check((size_t *)local_20,(uint64_t *)local_28,true,"mem_leak_test.log",false);
  printf("1st run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n",
         (ulong)local_20[0],(ulong)local_28[0]);
  __mem_leak_check((size_t *)local_20,(uint64_t *)local_28,true,"mem_leak_test.log",true);
  printf("\n2nd run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n",
         (ulong)local_20[0],(ulong)local_28[0]);
  __stop_and_free_all_mem();
  return 0;
}

Assistant:

int main( int argc, const char* argv[]) {

    // start collecting mem allocations info and dump info to "mem_allocations.log"
    MemPlumber::start(true, "mem_allocations.log");

    // init 2 objects
    int* num = new int(100);
    MyClass* myClass = new MyClass();

    // init 1 array of 10 objects
    MyClass* myClassArr = new MyClass[10];

    // run memory leak test in verbose mode and dump info to "mem_leak_test.log"
    size_t memLeakCount; 
    uint64_t memLeakSize;
    MemPlumber::memLeakCheck(memLeakCount, memLeakSize, true, "mem_leak_test.log");

    // print memory leak results
    printf("1st run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n", (int)memLeakCount, (int)memLeakSize);

    // free some memory (this will also be written to "mem_allocations.log")
    delete num;
    delete [] myClassArr;

    // run memory leak test again in verbose mode and dump info to the same file "mem_leak_test.log" but in append mode
    // this time we're expecting to find only 1 leaked object (myClass) since the other were already freed
    MemPlumber::memLeakCheck(memLeakCount, memLeakSize, true, "mem_leak_test.log", true);

    // print memory leak results
    printf("\n2nd run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n", (int)memLeakCount, (int)memLeakSize);

    // stop collecting mem allocations info and clean the reminaing mem leaks. This will also be dumped to "mem_allocations.log"
    MemPlumber::stopAndFreeAllMemory();

    return 0;
}